

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O0

void __thiscall
P2Pt::pose_poly<double>::rhos_from_root_ids
          (pose_poly<double> *this,double (*root_ids) [1899],double (*out) [3] [1899],
          uint *out_ts_len)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  uint *in_RCX;
  long in_RDX;
  long in_RSI;
  pose_poly<double> *in_RDI;
  pose_poly<double> *ppVar7;
  double beta_1_minus_x2;
  double alpha_ts_new2;
  double ts_den;
  double x2;
  double ts_new;
  uint i_1;
  double alpha_times_2;
  double (*rhos2) [1899];
  double (*rhos1) [1899];
  uint k;
  double f1;
  double f0;
  double *t2;
  double t1;
  double t0;
  uint i;
  uint *ts_end;
  double (*ts) [1899];
  uint local_84;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  pose_poly<double> *in_stack_ffffffffffffffa0;
  pose_poly<double> *local_58;
  double local_48;
  double local_40;
  uint local_34;
  
  *in_RCX = 0;
  for (local_34 = 0; local_34 < 0x76b; local_34 = local_34 + 1) {
    dVar1 = *(double *)(in_RSI + (ulong)local_34 * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      local_40 = t_vec(in_RDI,local_34);
      local_48 = t_vec(in_RDI,local_34 + 1);
      uVar3 = *in_RCX;
      *in_RCX = uVar3 + 1;
      pdVar6 = (double *)(in_RDX + (ulong)uVar3 * 8);
      t_vec(in_RDI,local_34);
      local_58 = (pose_poly<double> *)
                 fn_t(in_stack_ffffffffffffffa0,
                      (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      t_vec(in_RDI,local_34 + 1);
      ppVar7 = (pose_poly<double> *)
               fn_t(in_stack_ffffffffffffffa0,
                    (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      for (in_stack_ffffffffffffff9c = 0; in_stack_ffffffffffffffa0 = ppVar7,
          in_stack_ffffffffffffff9c < 3; in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1)
      {
        *pdVar6 = local_48 -
                  ((double)in_stack_ffffffffffffffa0 * (local_48 - local_40)) /
                  ((double)in_stack_ffffffffffffffa0 - (double)local_58);
        local_40 = local_48;
        local_48 = *pdVar6;
        ppVar7 = in_stack_ffffffffffffffa0;
        if (in_stack_ffffffffffffff9c + 1 < 3) {
          ppVar7 = (pose_poly<double> *)
                   fn_t(in_stack_ffffffffffffffa0,
                        (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        }
        local_58 = in_stack_ffffffffffffffa0;
      }
    }
  }
  dVar1 = in_RDI->alpha;
  for (local_84 = 0; local_84 < *in_RCX; local_84 = local_84 + 1) {
    dVar2 = *(double *)(in_RDX + (ulong)local_84 * 8);
    dVar4 = dVar2 * dVar2 + 1.0;
    dVar5 = dVar1 * 2.0 * dVar2;
    dVar2 = in_RDI->beta * (1.0 - dVar2 * dVar2);
    *(double *)(in_RDX + 0x3b58 + (ulong)local_84 * 8) =
         (dVar5 * in_RDI->cth + dVar2 * in_RDI->sth) / dVar4;
    *(double *)(in_RDX + 0x76b0 + (ulong)local_84 * 8) =
         (-dVar5 * in_RDI->sth + dVar2 * in_RDI->cth) / dVar4;
  }
  return;
}

Assistant:

inline void rhos_from_root_ids(
      const T (&root_ids)[ROOT_IDS_LEN], T (*out)[3][ROOT_IDS_LEN], unsigned *out_ts_len) { 
    T (&ts)[ROOT_IDS_LEN] = (*out)[0];
    unsigned &ts_end = *out_ts_len; ts_end = 0;
    for (unsigned i = 0; i < ROOT_IDS_LEN; i++) {
      if (!root_ids[i]) continue;
      T t0 = t_vec(i), t1 = t_vec(i+1), &t2 = ts[ts_end++];
      T f0 = fn_t(t_vec(i)), f1 = fn_t(t_vec(i+1));
      for (unsigned k = 0; k < 3; ++k) {
        t2 = t1 - f1*(t1-t0)/(f1-f0); t0 = t1; t1 = t2;
        f0 = f1; if (k + 1 < 3) f1 = fn_t(t2);
      }
    }
    //% Each root is now ts(i), plus minus t_stddev. Now get rho1(t):
    T (&rhos1)[ROOT_IDS_LEN] = (*out)[1]; T (&rhos2)[ROOT_IDS_LEN] = (*out)[2];
    const T alpha_times_2 = 2.*alpha;
    for (unsigned i = 0; i < ts_end; i++) {
      const T ts_new = ts[i],
      x2 = ts_new * ts_new,
      ts_den = 1. + x2,
      alpha_ts_new2 = alpha_times_2 * ts_new,
      beta_1_minus_x2 = beta * (1. - x2);
      rhos1[i] = ( alpha_ts_new2 * cth + beta_1_minus_x2 * sth) / ts_den;
      rhos2[i] = (-alpha_ts_new2 * sth + beta_1_minus_x2 * cth) / ts_den;
    }
  }